

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

vector<cppcms::json::value,_std::allocator<cppcms::json::value>_> * __thiscall
cppcms::json::variant::get<std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>>
          (variant *this)

{
  bad_value_cast *this_00;
  allocator local_39;
  string local_38;
  
  if (this->type == is_array) {
    return (vector<cppcms::json::value,_std::allocator<cppcms::json::value>_> *)this;
  }
  this_00 = (bad_value_cast *)__cxa_allocate_exception(0x48);
  std::__cxx11::string::string((string *)&local_38,"invalid type",&local_39);
  bad_value_cast::bad_value_cast(this_00,&local_38,is_array,this->type);
  __cxa_throw(this_00,&bad_value_cast::typeinfo,bad_value_cast::~bad_value_cast);
}

Assistant:

T const &get() const
		{
			json_type expected = json_type_traits<T>::type;
			if(expected != type) 
				throw bad_value_cast("invalid type",expected,type);
			switch(type) {
			case is_undefined:
			case is_null:
				throw bad_value_cast("non-fetchable type",type);
			default:
				return *static_cast<T const *>(ptr());
			}
		}